

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# common.h
# Opt level: O1

void dumpBytes(vector<unsigned_char,_std::allocator<unsigned_char>_> *value,bool inArray)

{
  byte bVar1;
  pointer puVar2;
  int iVar3;
  ulong uVar4;
  uint uVar5;
  pointer puVar6;
  long lVar7;
  size_t j;
  long lVar8;
  ulong uVar9;
  pointer puVar10;
  ulong uVar11;
  
  puVar2 = (value->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>)._M_impl.
           super__Vector_impl_data._M_start;
  puVar6 = (value->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>)._M_impl.
           super__Vector_impl_data._M_finish;
  uVar4 = (long)puVar6 - (long)puVar2;
  if (uVar4 < 8) {
    uVar11 = 0;
  }
  else {
    lVar7 = 0;
    uVar9 = 8;
    do {
      uVar11 = uVar9;
      lVar8 = 0;
      do {
        printf("%02hhx ",
               (ulong)(value->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>).
                      _M_impl.super__Vector_impl_data._M_start[lVar8 + lVar7]);
        lVar8 = lVar8 + 1;
      } while (lVar8 != 8);
      if (inArray) {
        putchar(0x20);
      }
      putchar(0x3c);
      lVar8 = 0;
      do {
        bVar1 = (value->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>)._M_impl.
                super__Vector_impl_data._M_start[lVar8 + lVar7];
        uVar5 = (uint)bVar1;
        iVar3 = isgraph((uint)bVar1);
        if (iVar3 == 0) {
          uVar5 = 0x2e;
        }
        putchar(uVar5);
        lVar8 = lVar8 + 1;
      } while (lVar8 != 8);
      puts(">");
      lVar7 = lVar7 + 8;
      uVar9 = uVar11 + 8;
    } while (uVar11 + 8 <= uVar4);
  }
  uVar4 = uVar4 - uVar11;
  if (uVar4 != 0) {
    uVar9 = 0;
    do {
      printf("%02hhx ",
             (ulong)(value->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>).
                    _M_impl.super__Vector_impl_data._M_start[uVar9 + uVar11]);
      uVar9 = uVar9 + 1;
    } while (uVar9 < uVar4);
    uVar9 = ~uVar11;
    if (uVar4 < 8) {
      puVar10 = puVar6 + (uVar9 - (long)puVar2);
      do {
        printf("   ");
        puVar10 = puVar10 + 1;
      } while (puVar10 < (pointer)0x7);
    }
    if (inArray) {
      putchar(0x20);
    }
    putchar(0x3c);
    lVar7 = uVar4 + (uVar4 == 0);
    do {
      uVar5 = (uint)(value->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>).
                    _M_impl.super__Vector_impl_data._M_start[uVar11];
      iVar3 = isgraph(uVar5);
      if (iVar3 == 0) {
        uVar5 = 0x2e;
      }
      putchar(uVar5);
      uVar11 = uVar11 + 1;
      lVar7 = lVar7 + -1;
    } while (lVar7 != 0);
    if (uVar4 < 8) {
      puVar6 = puVar6 + (uVar9 - (long)puVar2);
      do {
        putchar(0x20);
        puVar6 = puVar6 + 1;
      } while (puVar6 < (pointer)0x7);
    }
    puts(">");
    return;
  }
  return;
}

Assistant:

void dumpBytes(const std::vector<uint8_t>& value, bool inArray = false)
{
	size_t len = value.size();
	size_t i = 0;
	while (i + 8 <= len)
	{
		for (size_t j = 0; j < 8; j++)
		{
			printf("%02hhx ", value[i + j]);
		}
		if (inArray)
		{
			printf(" ");
		}
		printf("<");
		for (size_t j = 0; j < 8; j++)
		{
			uint8_t c = value[i + j];
			if (isgraph((int) c) == 0)
			{
				printf(".");
			}
			else
			{
				printf("%c", (int) c);
			}
		}
		printf(">\n");
		i += 8;
	}
	len -= i;
	if (len == 0)
	{
		return;
	}

	for (size_t j = 0; j < len; j++)
	{
		printf("%02hhx ", value[i + j]);
	}
	for (size_t j = len; j < 8; j++)
	{
		printf("   ");
	}
	if (inArray)
	{
		printf(" ");
	}
	printf("<");
	for (size_t j = 0; j < len; j++)
	{
		uint8_t c = value[i + j];
		if (isgraph((int) c) == 0)
		{
			printf(".");
		}
		else
		{
			printf("%c", (int) c);
		}
	}
	for (size_t j =len; j < 8; j++)
	{
		printf(" ");
	}
	printf(">\n");
}